

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# yuv.c
# Opt level: O3

void ConvertBGR24ToY_C(uint8_t *bgr,uint8_t *y,int width)

{
  ulong uVar1;
  byte *pbVar2;
  
  if (0 < width) {
    pbVar2 = bgr + 2;
    uVar1 = 0;
    do {
      y[uVar1] = (uint8_t)((uint)pbVar2[-2] * 0x1914 +
                           (uint)pbVar2[-1] * 0x8123 + (uint)*pbVar2 * 0x41c7 + 0x108000 >> 0x10);
      uVar1 = uVar1 + 1;
      pbVar2 = pbVar2 + 3;
    } while ((uint)width != uVar1);
  }
  return;
}

Assistant:

static void ConvertBGR24ToY_C(const uint8_t* WEBP_RESTRICT bgr,
                              uint8_t* WEBP_RESTRICT y, int width) {
  int i;
  for (i = 0; i < width; ++i, bgr += 3) {
    y[i] = VP8RGBToY(bgr[2], bgr[1], bgr[0], YUV_HALF);
  }
}